

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

cf_list_iter_t cf_list_find(cf_list_t *self,void *data,cf_alg_equal_f eqf)

{
  cf_bool_t cVar1;
  cf_list_iter_t pcVar2;
  
  pcVar2 = self;
  do {
    pcVar2 = pcVar2->next;
    if (pcVar2 == self) {
      return (cf_list_iter_t)0x0;
    }
    cVar1 = (*eqf)(data,pcVar2->data);
  } while (cVar1 == 0);
  return pcVar2;
}

Assistant:

cf_list_iter_t cf_list_find(cf_list_t* self, void* data, cf_alg_equal_f eqf) {
    cf_list_iter_t it = cf_list_iter_init(self);

    while (!cf_list_iter_end(self, it)) {
        if (eqf(data, cf_list_iter_data(it))) {
            return it;
        }

        it = cf_list_iter_next(it);
    }
    return CF_NULL_PTR;
}